

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Bloaty::ScanAndRollupFile
          (Bloaty *this,string *filename,Rollup *rollup,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_build_ids)

{
  bool bVar1;
  reference ppCVar2;
  pointer pOVar3;
  ulong uVar4;
  pointer ppVar5;
  int64_t iVar6;
  int64_t iVar7;
  reference ppRVar8;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *this_00;
  InputFile *this_01;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *pvVar9;
  undefined8 uVar10;
  Rollup *in_RDX;
  long *in_RDI;
  string_view sVar11;
  int64_t filesize;
  RangeSink *sink;
  iterator __end1_1;
  iterator __begin1_1;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *__range1_1;
  int64_t filesize_before;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> sourcemap_file;
  const_iterator sourcemap_iter;
  const_iterator iter;
  string build_id;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> debug_file;
  ConfiguredDataSource *source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_> *__range1;
  NameMunger empty_munger;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> filename_sink_ptrs;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> sink_ptrs;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  sinks;
  DualMaps maps;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> file;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *in_stack_fffffffffffffd00;
  value_type *in_stack_fffffffffffffd08;
  DualMaps *in_stack_fffffffffffffd10;
  DualMap *in_stack_fffffffffffffd18;
  RangeSink *in_stack_fffffffffffffd20;
  RangeMap *in_stack_fffffffffffffd28;
  anon_class_8_1_89918b91 in_stack_fffffffffffffd30;
  InputFile **in_stack_fffffffffffffd38;
  ObjectFile *in_stack_fffffffffffffd48;
  ObjectFile *in_stack_fffffffffffffd50;
  ObjectFile *this_02;
  string *in_stack_fffffffffffffd60;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file_00;
  const_iterator in_stack_fffffffffffffd78;
  DualMaps *in_stack_fffffffffffffd80;
  pointer in_stack_fffffffffffffda0;
  Bloaty *in_stack_fffffffffffffda8;
  string_view local_210;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *local_200;
  RangeSink *local_1f8;
  RangeSink *local_1f0;
  RangeSink *local_1e8;
  RangeSink **local_1e0;
  __normal_iterator<bloaty::RangeSink_**,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
  local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  string local_1c0 [32];
  ObjectFile local_1a0;
  _Base_ptr local_188;
  _Self local_180;
  _Self local_178;
  DualMaps local_170;
  string local_158 [40];
  pointer local_130;
  pointer local_128;
  pointer local_120;
  DualMap *local_118;
  InputFile *local_110;
  ConfiguredDataSource *local_100;
  ConfiguredDataSource **local_f8;
  __normal_iterator<bloaty::ConfiguredDataSource_*const_*,_std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>_>
  local_f0;
  long *local_e8;
  pointer local_e0;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined4 local_ac;
  InputFile *local_a8;
  undefined1 local_98 [24];
  undefined1 local_80 [104];
  Rollup *local_18;
  
  local_18 = in_RDX;
  GetObjectFile(in_stack_fffffffffffffda8,(string *)in_stack_fffffffffffffda0);
  DualMaps::DualMaps(in_stack_fffffffffffffd10);
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::vector((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
            *)0x18c668);
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::vector
            ((vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *)0x18c675);
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::vector
            ((vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *)0x18c682);
  std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)0x18c68f);
  local_a8 = ObjectFile::file_data((ObjectFile *)0x18c697);
  local_ac = 6;
  local_b8 = 0;
  local_c0 = 0;
  std::
  make_unique<bloaty::RangeSink,bloaty::InputFile_const*,bloaty::Options_const&,bloaty::DataSource,decltype(nullptr),decltype(nullptr)>
            (in_stack_fffffffffffffd38,(Options *)in_stack_fffffffffffffd30.sink,
             (DataSource *)in_stack_fffffffffffffd28,&in_stack_fffffffffffffd20->file_,
             (void **)in_stack_fffffffffffffd18);
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::push_back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
               *)in_stack_fffffffffffffd00,
              (value_type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
             in_stack_fffffffffffffd00);
  NameMunger::NameMunger((NameMunger *)0x18c740);
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
          *)in_stack_fffffffffffffd00);
  std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::operator->
            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)0x18c757);
  DualMaps::base_map((DualMaps *)0x18c76c);
  RangeSink::AddOutput
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (NameMunger *)in_stack_fffffffffffffd10);
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
          *)in_stack_fffffffffffffd00);
  local_e0 = std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::get
                       ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
                        in_stack_fffffffffffffd00);
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::push_back
            (in_stack_fffffffffffffd00,
             (value_type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  local_e8 = in_RDI + 0x23;
  local_f0._M_current =
       (ConfiguredDataSource **)
       std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
       ::begin((vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  local_f8 = (ConfiguredDataSource **)
             std::
             vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
             ::end((vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                    *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<bloaty::ConfiguredDataSource_*const_*,_std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>_>
                             *)in_stack_fffffffffffffd00,
                            (__normal_iterator<bloaty::ConfiguredDataSource_*const_*,_std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)), bVar1
        ) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<bloaty::ConfiguredDataSource_*const_*,_std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>_>
              ::operator*(&local_f0);
    local_100 = *ppCVar2;
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)0x18c84c)
    ;
    local_110 = ObjectFile::file_data((ObjectFile *)0x18c854);
    local_118 = DualMaps::base_map((DualMaps *)0x18c8a3);
    local_120 = std::
                unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
                get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                     *)in_stack_fffffffffffffd00);
    std::
    make_unique<bloaty::RangeSink,bloaty::InputFile_const*,bloaty::Options_const&,bloaty::DataSource&,bloaty::DualMap*,google::protobuf::Arena*>
              (in_stack_fffffffffffffd38,(Options *)in_stack_fffffffffffffd30.sink,
               (DataSource *)in_stack_fffffffffffffd28,(DualMap **)in_stack_fffffffffffffd20,
               (Arena **)in_stack_fffffffffffffd18);
    std::
    vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
    ::push_back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                 *)in_stack_fffffffffffffd00,
                (value_type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
              ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
               in_stack_fffffffffffffd00);
    std::
    vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
    ::back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
            *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffda0 =
         std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::operator->
                   ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
                    0x18c949);
    in_stack_fffffffffffffda8 = (Bloaty *)DualMaps::AppendMap(in_stack_fffffffffffffd10);
    std::unique_ptr<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_>::get
              ((unique_ptr<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_> *)
               in_stack_fffffffffffffd00);
    RangeSink::AddOutput
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (NameMunger *)in_stack_fffffffffffffd10);
    if (local_100->effective_source == kInputFiles) {
      std::
      vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
      ::back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
              *)in_stack_fffffffffffffd00);
      local_128 = std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::get
                            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>
                              *)in_stack_fffffffffffffd00);
      std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::push_back
                (in_stack_fffffffffffffd00,
                 (value_type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    }
    else {
      std::
      vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
      ::back((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
              *)in_stack_fffffffffffffd00);
      local_130 = std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::get
                            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>
                              *)in_stack_fffffffffffffd00);
      std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::push_back
                (in_stack_fffffffffffffd00,
                 (value_type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    }
    __gnu_cxx::
    __normal_iterator<bloaty::ConfiguredDataSource_*const_*,_std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>_>
    ::operator++(&local_f0);
  }
  std::unique_ptr<bloaty::ObjectFile,std::default_delete<bloaty::ObjectFile>>::
  unique_ptr<std::default_delete<bloaty::ObjectFile>,void>
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
             in_stack_fffffffffffffd00);
  pOVar3 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      0x18cad9);
  (*pOVar3->_vptr_ObjectFile[2])(local_158);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_170.maps_.
    super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                         (key_type *)0x18cb20);
    local_170.maps_.
    super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    bVar1 = std::operator!=((_Self *)&local_170.maps_.
                                      super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (_Self *)&local_170.maps_.
                                      super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x18cb81);
      GetObjectFile(in_stack_fffffffffffffda8,(string *)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffd80 = &local_170;
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator=
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 in_stack_fffffffffffffd00,
                 (unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 in_stack_fffffffffffffd00);
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 0x18cbde);
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::get
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 in_stack_fffffffffffffd00);
      ObjectFile::set_debug_file(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    }
    in_stack_fffffffffffffd78 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                (key_type *)0x18cc6c);
    local_178._M_node = in_stack_fffffffffffffd78._M_node;
    local_180._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    bVar1 = std::operator==(&local_178,&local_180);
    if (bVar1) {
      local_188 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                         (key_type *)0x18ccd9);
      local_178._M_node = local_188;
    }
    local_1a0.debug_file_ =
         (ObjectFile *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    bVar1 = std::operator!=(&local_178,(_Self *)&local_1a0.debug_file_);
    if (bVar1) {
      file_00 = (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)*in_RDI;
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x18cd54);
      (*(code *)(((file_00->_M_t).
                  super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                  .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl)->filename_).
                _M_string_length)(&local_1a0.file_data_,file_00,&ppVar5->second);
      std::__cxx11::string::string(local_1c0,local_158);
      TryOpenSourceMapFile(file_00,in_stack_fffffffffffffd60);
      this_02 = &local_1a0;
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator=
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 in_stack_fffffffffffffd00,
                 (unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 in_stack_fffffffffffffd00);
      std::__cxx11::string::~string(local_1c0);
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 0x18cdec);
      std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::get
                ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                 in_stack_fffffffffffffd00);
      ObjectFile::set_debug_file(this_02,in_stack_fffffffffffffd48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::~unique_ptr
                ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                 in_stack_fffffffffffffd10);
    }
  }
  iVar6 = Rollup::file_total(local_18);
  iVar7 = Rollup::filtered_file_total(local_18);
  local_1c8 = iVar6 + iVar7;
  pOVar3 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      0x18cec5);
  (*pOVar3->_vptr_ObjectFile[3])(pOVar3,local_80);
  local_1d0 = local_98;
  local_1d8._M_current =
       (RangeSink **)
       std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::begin
                 ((vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *)
                  CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  local_1e0 = (RangeSink **)
              std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::end
                        ((vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *)
                         CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<bloaty::RangeSink_**,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
                             *)in_stack_fffffffffffffd00,
                            (__normal_iterator<bloaty::RangeSink_**,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)), bVar1
        ) {
    ppRVar8 = __gnu_cxx::
              __normal_iterator<bloaty::RangeSink_**,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
              ::operator*(&local_1d8);
    local_1e8 = *ppRVar8;
    DualMaps::base_map((DualMaps *)0x18cf58);
    local_1f0 = local_1e8;
    RangeMap::
    ForEachRange<bloaty::Bloaty::ScanAndRollupFile(std::__cxx11::string_const&,bloaty::Rollup*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd30.sink = (RangeSink *)DualMaps::base_map((DualMaps *)0x18cf90);
    local_1f8 = local_1e8;
    RangeMap::
    ForEachRange<bloaty::Bloaty::ScanAndRollupFile(std::__cxx11::string_const&,bloaty::Rollup*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__1>
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
    __gnu_cxx::
    __normal_iterator<bloaty::RangeSink_**,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
    ::operator++(&local_1d8);
  }
  DualMaps::ComputeRollup(in_stack_fffffffffffffd80,(Rollup *)in_stack_fffffffffffffd78._M_node);
  iVar6 = Rollup::file_total(local_18);
  iVar7 = Rollup::filtered_file_total(local_18);
  this_00 = (vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *)
            ((iVar6 + iVar7) - local_1c8);
  local_200 = this_00;
  std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)0x18d04c);
  this_01 = ObjectFile::file_data((ObjectFile *)0x18d054);
  sVar11 = InputFile::data(this_01);
  local_210 = sVar11;
  pvVar9 = (vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *)
           std::basic_string_view<char,_std::char_traits<char>_>::size(&local_210);
  if (this_00 != pvVar9) {
    __assert_fail("filesize == file->file_data().data().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x71d,
                  "void bloaty::Bloaty::ScanAndRollupFile(const std::string &, Rollup *, std::vector<std::string> *) const"
                 );
  }
  if (verbose_level < 1) {
    bVar1 = Options::dump_raw_map((Options *)0x18d0e0);
    if (!bVar1) goto LAB_0018d166;
  }
  uVar10 = std::__cxx11::string::c_str();
  printf("Maps for %s:\n\n",uVar10);
  if (show != 1) {
    printf("FILE MAP:\n");
    DualMaps::PrintFileMaps((DualMaps *)in_stack_fffffffffffffd30.sink);
  }
  if (show != 0) {
    printf("VM MAP:\n");
    DualMaps::PrintVMMaps((DualMaps *)in_stack_fffffffffffffd30.sink);
  }
LAB_0018d166:
  std::__cxx11::string::~string(local_158);
  std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
             sVar11._M_str);
  NameMunger::~NameMunger((NameMunger *)0x18d18d);
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::~vector(this_00);
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::~vector(this_00);
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::~vector((vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
             *)this_00);
  DualMaps::~DualMaps((DualMaps *)0x18d1c1);
  std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
             sVar11._M_str);
  return;
}

Assistant:

void Bloaty::ScanAndRollupFile(const std::string& filename, Rollup* rollup,
                               std::vector<std::string>* out_build_ids) const {
  auto file = GetObjectFile(filename);

  DualMaps maps;
  std::vector<std::unique_ptr<RangeSink>> sinks;
  std::vector<RangeSink*> sink_ptrs;
  std::vector<RangeSink*> filename_sink_ptrs;

  // Base map always goes first.
  sinks.push_back(absl::make_unique<RangeSink>(
      &file->file_data(), options_, DataSource::kSegments, nullptr, nullptr));
  NameMunger empty_munger;
  sinks.back()->AddOutput(maps.base_map(), &empty_munger);
  sink_ptrs.push_back(sinks.back().get());

  for (auto source : sources_) {
    sinks.push_back(absl::make_unique<RangeSink>(
        &file->file_data(), options_, source->effective_source, maps.base_map(),
        arena_.get()));
    sinks.back()->AddOutput(maps.AppendMap(), source->munger.get());
    // We handle the kInputFiles data source internally, without handing it off
    // to the file format implementation.  This seems slightly simpler, since
    // the file format has to deal with armembers too.
    if (source->effective_source == DataSource::kInputFiles) {
      filename_sink_ptrs.push_back(sinks.back().get());
    } else {
      sink_ptrs.push_back(sinks.back().get());
    }
  }

  std::unique_ptr<ObjectFile> debug_file;
  std::string build_id = file->GetBuildId();
  if (!build_id.empty()) {
    auto iter = debug_files_.find(build_id);
    if (iter != debug_files_.end()) {
      debug_file = GetObjectFile(iter->second);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }

    // Maybe it's a source map file?
    auto sourcemap_iter = sourcemap_files_.find(build_id);
    // If the source map by build id isn't found, try the file name.
    if (sourcemap_iter == sourcemap_files_.end()) {
      sourcemap_iter = sourcemap_files_.find(filename);
    }
    if (sourcemap_iter != sourcemap_files_.end()) {
      std::unique_ptr<InputFile> sourcemap_file(
          file_factory_.OpenFile(sourcemap_iter->second));
      // The build id is not present in the source map file itself, so it must
      // be passed here.
      debug_file = TryOpenSourceMapFile(sourcemap_file, build_id);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }
  }

  int64_t filesize_before =
      rollup->file_total() + rollup->filtered_file_total();
  file->ProcessFile(sink_ptrs);

  // kInputFile source: Copy the base map to the filename sink(s).
  for (auto sink : filename_sink_ptrs) {
    maps.base_map()->vm_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddVMRange("inputfile_vmcopier", start, length,
                           sink->input_file().filename());
        });
    maps.base_map()->file_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddFileRange("inputfile_filecopier",
                             sink->input_file().filename(), start, length);
        });
  }

  maps.ComputeRollup(rollup);

  // The ObjectFile implementation must guarantee this.
  int64_t filesize =
      rollup->file_total() + rollup->filtered_file_total() - filesize_before;
  (void)filesize;
  assert(filesize == file->file_data().data().size());

  if (verbose_level > 0 || options_.dump_raw_map()) {
    printf("Maps for %s:\n\n", filename.c_str());
    if (show != ShowDomain::kShowVM) {
      printf("FILE MAP:\n");
      maps.PrintFileMaps();
    }
    if (show != ShowDomain::kShowFile) {
      printf("VM MAP:\n");
      maps.PrintVMMaps();
    }
  }
}